

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O2

void __thiscall so_5::state_t::state_t(state_t *this,state_t *other)

{
  state_t *psVar1;
  size_t sVar2;
  
  this->m_target_agent = other->m_target_agent;
  std::__cxx11::string::string((string *)&this->m_state_name,(string *)&other->m_state_name);
  psVar1 = other->m_initial_substate;
  this->m_parent_state = other->m_parent_state;
  this->m_initial_substate = psVar1;
  this->m_state_history = other->m_state_history;
  this->m_last_active_substate = other->m_last_active_substate;
  sVar2 = other->m_substate_count;
  this->m_nested_level = other->m_nested_level;
  this->m_substate_count = sVar2;
  std::function<void_()>::function(&this->m_on_enter,&other->m_on_enter);
  std::function<void_()>::function(&this->m_on_exit,&other->m_on_exit);
  (this->m_time_limit)._M_t.
  super___uniq_ptr_impl<so_5::state_t::time_limit_t,_std::default_delete<so_5::state_t::time_limit_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::state_t::time_limit_t_*,_std::default_delete<so_5::state_t::time_limit_t>_>
  .super__Head_base<0UL,_so_5::state_t::time_limit_t_*,_false>._M_head_impl = (time_limit_t *)0x0;
  psVar1 = this->m_parent_state;
  if ((psVar1 != (state_t *)0x0) && (psVar1->m_initial_substate == other)) {
    psVar1->m_initial_substate = this;
  }
  return;
}

Assistant:

state_t::state_t(
	state_t && other )
	:	m_target_agent( other.m_target_agent )
	,	m_state_name( std::move( other.m_state_name ) )
	,	m_parent_state{ other.m_parent_state }
	,	m_initial_substate{ other.m_initial_substate }
	,	m_state_history{ other.m_state_history }
	,	m_last_active_substate{ other.m_last_active_substate }
	,	m_nested_level{ other.m_nested_level }
	,	m_substate_count{ other.m_substate_count }
	,	m_on_enter{ std::move(other.m_on_enter) }
	,	m_on_exit{ std::move(other.m_on_exit) }
{
	if( m_parent_state && m_parent_state->m_initial_substate == &other )
		m_parent_state->m_initial_substate = this;
}